

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

Expression * __thiscall
wasm::SExpressionWasmBuilder::makeCallRef(SExpressionWasmBuilder *this,Element *s,bool isReturn)

{
  bool bVar1;
  Element *pEVar2;
  size_t sVar3;
  Expression *target;
  CallRef *pCVar4;
  string *this_00;
  char *__s;
  Signature SVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  HeapType local_38;
  HeapType sigType;
  
  pEVar2 = Element::operator[](s,1);
  local_38 = parseHeapType(this,pEVar2);
  auStack_58 = (undefined1  [8])0x0;
  operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar3 = Element::size(s);
  parseOperands<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            (this,s,2,(int)sVar3 - 1,
             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58);
  sVar3 = Element::size(s);
  pEVar2 = Element::operator[](s,(int)sVar3 - 1);
  target = parseExpression(this,pEVar2);
  bVar1 = HeapType::isSignature(&local_38);
  if (bVar1) {
    local_78._M_dataplus._M_p = (pointer)this->wasm;
    SVar5 = HeapType::getSignature(&local_38);
    pCVar4 = Builder::makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                       ((Builder *)&local_78,target,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        auStack_58,SVar5.results.id,isReturn);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58);
    return (Expression *)pCVar4;
  }
  this_00 = (string *)__cxa_allocate_exception(0x30);
  __s = "call_ref";
  if (isReturn) {
    __s = "return_call_ref";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,__s,(allocator<char> *)((long)&sigType.id + 7));
  std::operator+(&local_a8,&local_78," type annotation should be a signature");
  local_88 = s->line;
  uStack_80 = s->col;
  std::__cxx11::string::string(this_00,(string *)&local_a8);
  *(undefined4 *)(this_00 + 0x20) = (undefined4)local_88;
  *(undefined4 *)(this_00 + 0x24) = local_88._4_4_;
  *(undefined4 *)(this_00 + 0x28) = (undefined4)uStack_80;
  *(undefined4 *)(this_00 + 0x2c) = uStack_80._4_4_;
  __cxa_throw(this_00,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

Expression* SExpressionWasmBuilder::makeCallRef(Element& s, bool isReturn) {
  HeapType sigType = parseHeapType(*s[1]);
  std::vector<Expression*> operands;
  parseOperands(s, 2, s.size() - 1, operands);
  auto* target = parseExpression(s[s.size() - 1]);

  if (!sigType.isSignature()) {
    throw ParseException(
      std::string(isReturn ? "return_call_ref" : "call_ref") +
        " type annotation should be a signature",
      s.line,
      s.col);
  }
  return Builder(wasm).makeCallRef(
    target, operands, sigType.getSignature().results, isReturn);
}